

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_pipeline.cpp
# Opt level: O2

string * format_map_abi_cxx11_
                   (string *__return_storage_ptr__,
                   unordered_map<char,_unsigned_long,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_unsigned_long>_>_>
                   *map)

{
  ostream *poVar1;
  __node_base *p_Var2;
  ostringstream oss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  p_Var2 = &(map->_M_h)._M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    poVar1 = std::operator<<((ostream *)&oss,(char)*(size_type *)(p_Var2 + 1));
    poVar1 = std::operator<<(poVar1,':');
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,' ');
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  return __return_storage_ptr__;
}

Assistant:

std::string format_map(const std::unordered_map<char, size_t>& map) {
  std::ostringstream oss;
  for(const auto& [i, j] : map) {
    oss << i << ':' << j << ' ';
  }
  return oss.str();
}